

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

StuntDouble * __thiscall OpenMD::SelectionManager::nextUnselected(SelectionManager *this,int *i)

{
  bool bVar1;
  size_t sVar2;
  reference ppSVar3;
  int *in_RSI;
  OpenMDBitSet *in_RDI;
  int bitIndex;
  
  *in_RSI = *in_RSI + 1;
  while( true ) {
    bitIndex = *in_RSI;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
               &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,0);
    sVar2 = OpenMDBitSet::size((OpenMDBitSet *)0x1c0b49);
    if ((int)sVar2 <= bitIndex) {
      return (value_type)0x0;
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
               &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,0);
    bVar1 = OpenMDBitSet::operator[](in_RDI,bitIndex);
    if ((!bVar1) &&
       (ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)&in_RDI[1].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_finish,(long)*in_RSI),
       *ppSVar3 != (value_type)0x0)) break;
    *in_RSI = *in_RSI + 1;
  }
  ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                      ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                       &in_RDI[1].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish,(long)*in_RSI);
  return *ppSVar3;
}

Assistant:

StuntDouble* SelectionManager::nextUnselected(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[STUNTDOUBLE].size())) {
      if (!ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) return stuntdoubles_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[STUNTDOUBLE].nextOffBit(i);
    return i == -1 ? NULL : stuntdoubles_[i];
#endif
  }